

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<google::protobuf::internal::LazyString>
          (ArenaStringPtr *this,Arena *arena,LazyString *lazy_default)

{
  LazyString *this_00;
  bool bVar1;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *new_string;
  byte local_101;
  LogMessage local_100;
  undefined8 local_c8;
  string *default_value;
  LazyString *lazy_default_local;
  Arena *arena_local;
  ArenaStringPtr *this_local;
  LazyString *local_a0;
  string *local_98;
  LazyString *local_90;
  string *local_88;
  LazyString *local_80;
  string *local_78;
  LazyString *local_70;
  string *local_58;
  LazyString *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string *local_40;
  undefined1 local_31;
  LazyString *local_30;
  size_t local_28;
  size_t n;
  LazyString *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_c8 = 0;
  default_value = (string *)lazy_default;
  lazy_default_local = (LazyString *)arena;
  arena_local = (Arena *)this;
  bVar1 = IsDefault(this,(string *)0x0);
  local_101 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,"third_party/protobuf-lite/arenastring.cc",0x93);
    local_101 = 1;
    other = LogMessage::operator<<(&local_100,"CHECK failed: IsDefault(default_value): ");
    LogFinisher::operator=((LogFinisher *)((long)&new_string + 3),other);
  }
  if ((local_101 & 1) != 0) {
    LogMessage::~LogMessage(&local_100);
  }
  this_00 = lazy_default_local;
  this_local = (ArenaStringPtr *)LazyString::get_abi_cxx11_((LazyString *)default_value);
  local_a0 = this_00;
  local_90 = this_00;
  local_80 = this_00;
  local_70 = this_00;
  local_50 = this_00;
  local_98 = (string *)this_local;
  local_88 = (string *)this_local;
  local_78 = (string *)this_local;
  local_58 = (string *)this_local;
  if (this_00 == (LazyString *)0x0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    std::__cxx11::string::string((string *)pbVar2,(string *)local_58);
    local_48 = pbVar2;
  }
  else {
    local_30 = this_00;
    local_31 = 0;
    local_18 = this_00;
    n._7_1_ = 0;
    local_40 = (string *)this_local;
    local_28 = AlignUpTo8(0x20);
    ArenaImpl::RecordAlloc
              ((ArenaImpl *)this_00,(type_info *)&std::__cxx11::string::typeinfo,local_28);
    if ((n._7_1_ & 1) == 0) {
      local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           ((ArenaImpl *)this_00,local_28,
                            arena_destruct_object<std::__cxx11::string>);
    }
    else {
      local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Arena::AllocateAlignedTo<8ul>((Arena *)this_00,0x20);
    }
    pbVar2 = local_10;
    std::__cxx11::string::string((string *)local_10,(string *)local_40);
    local_48 = pbVar2;
  }
  pbVar2 = local_48;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
            (&this->tagged_ptr_,local_48);
  return pbVar2;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}